

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O2

void __thiscall IntegerCompressor::compress(IntegerCompressor *this,I32 pred,I32 real,U32 context)

{
  I32 c;
  
  if (this->enc != (ArithmeticEncoder *)0x0) {
    c = real - pred;
    if (c < this->corr_min) {
      c = c + this->corr_range;
    }
    else if (this->corr_max < c) {
      c = c - this->corr_range;
    }
    writeCorrector(this,c,this->mBits[context]);
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                ,0x10a,"void IntegerCompressor::compress(I32, I32, U32)");
}

Assistant:

void IntegerCompressor::compress(I32 pred, I32 real, U32 context)
{
  assert(enc);
  // the corrector will be within the interval [ - (corr_range - 1)  ...  + (corr_range - 1) ]
  I32 corr = real - pred;
  // we fold the corrector into the interval [ corr_min  ...  corr_max ]
  if (corr < corr_min) corr += corr_range;
  else if (corr > corr_max) corr -= corr_range;
  writeCorrector(corr, mBits[context]);
}